

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatOffsetLocalizedGMT
          (TimeZoneFormat *this,int32_t offset,UBool isShort,UnicodeString *result,
          UErrorCode *status)

{
  UVector *this_00;
  uint uVar1;
  void *pvVar2;
  uint8_t minDigits;
  long lVar3;
  uint uVar4;
  long lVar5;
  int index;
  ConstChar16Ptr local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  char16_t *local_40;
  
  if (U_ZERO_ERROR < *status) {
    UnicodeString::setToBogus(result);
    return result;
  }
  if (offset + 0xfad9a400U < 0xf5b34801) {
    UnicodeString::setToBogus(result);
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
  }
  if (offset == 0) {
    UnicodeString::setTo(result,&this->fGMTZeroFormat);
    return result;
  }
  uVar4 = -offset;
  if (0 < offset) {
    uVar4 = offset;
  }
  local_44 = uVar4 / 3600000;
  uVar4 = uVar4 % 3600000;
  local_48 = uVar4 / 60000;
  uVar1 = uVar4 % 60000;
  local_4c = uVar1 / 1000;
  if (offset < 0) {
    lVar5 = 0x508;
    if (999 < uVar1) goto LAB_0020c5de;
    lVar5 = 0x518;
    lVar3 = 0x500;
    if (59999 < uVar4) {
      lVar5 = 0x500;
    }
  }
  else {
    lVar5 = 0x4f8;
    if (999 < uVar1) goto LAB_0020c5de;
    lVar3 = 0x4f0;
    lVar5 = (ulong)(uVar4 < 60000) * 0x20 + 0x4f0;
  }
  if (isShort == '\0') {
    lVar5 = lVar3;
  }
LAB_0020c5de:
  this_00 = *(UVector **)((this->super_Format).actualLocale + lVar5 + -8);
  UnicodeString::setTo(result,&this->fGMTPatternPrefix);
  index = 0;
  do {
    if (this_00->count <= index) {
      UnicodeString::append(result,&this->fGMTPatternSuffix);
      return result;
    }
    pvVar2 = UVector::elementAt(this_00,index);
    switch(*(undefined4 *)((long)pvVar2 + 0x10)) {
    case 0:
      local_58.p_ = *(char16_t **)((long)pvVar2 + 8);
      UnicodeString::append(result,&local_58,-1);
      local_40 = local_58.p_;
      break;
    case 1:
      uVar4 = local_44;
      minDigits = (isShort == '\0') + '\x01';
      goto LAB_0020c67e;
    case 2:
      uVar4 = local_48;
      goto LAB_0020c67b;
    case 4:
      uVar4 = local_4c;
LAB_0020c67b:
      minDigits = '\x02';
LAB_0020c67e:
      appendOffsetDigits(this,result,uVar4,minDigits);
    }
    index = index + 1;
  } while( true );
}

Assistant:

UnicodeString&
TimeZoneFormat::formatOffsetLocalizedGMT(int32_t offset, UBool isShort, UnicodeString& result, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        result.setToBogus();
        return result;
    }
    if (offset <= -MAX_OFFSET || offset >= MAX_OFFSET) {
        result.setToBogus();
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    if (offset == 0) {
        result.setTo(fGMTZeroFormat);
        return result;
    }

    UBool positive = TRUE;
    if (offset < 0) {
        offset = -offset;
        positive = FALSE;
    }

    int32_t offsetH = offset / MILLIS_PER_HOUR;
    offset = offset % MILLIS_PER_HOUR;
    int32_t offsetM = offset / MILLIS_PER_MINUTE;
    offset = offset % MILLIS_PER_MINUTE;
    int32_t offsetS = offset / MILLIS_PER_SECOND;

    U_ASSERT(offsetH <= MAX_OFFSET_HOUR && offsetM <= MAX_OFFSET_MINUTE && offsetS <= MAX_OFFSET_SECOND);

    const UVector* offsetPatternItems = NULL;
    if (positive) {
        if (offsetS != 0) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_HMS];
        } else if (offsetM != 0 || !isShort) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_HM];
        } else {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_H];
        }
    } else {
        if (offsetS != 0) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_HMS];
        } else if (offsetM != 0 || !isShort) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_HM];
        } else {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_H];
        }
    }

    U_ASSERT(offsetPatternItems != NULL);

    // Building the GMT format string
    result.setTo(fGMTPatternPrefix);

    for (int32_t i = 0; i < offsetPatternItems->size(); i++) {
        const GMTOffsetField* item = (GMTOffsetField*)offsetPatternItems->elementAt(i);
        GMTOffsetField::FieldType type = item->getType();

        switch (type) {
        case GMTOffsetField::TEXT:
            result.append(item->getPatternText(), -1);
            break;

        case GMTOffsetField::HOUR:
            appendOffsetDigits(result, offsetH, (isShort ? 1 : 2));
            break;

        case GMTOffsetField::MINUTE:
            appendOffsetDigits(result, offsetM, 2);
            break;

        case GMTOffsetField::SECOND:
            appendOffsetDigits(result, offsetS, 2);
            break;
        }
    }

    result.append(fGMTPatternSuffix);
    return result;
}